

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O1

uint32_t __thiscall
cfd::core::Transaction::AddTxIn
          (Transaction *this,Txid *txid,uint32_t index,uint32_t sequence,Script *unlocking_script)

{
  pointer pTVar1;
  pointer pTVar2;
  bool bVar3;
  CfdException *this_00;
  TxIn txin;
  AbstractTxIn local_150;
  AbstractTxIn local_c0;
  
  if ((long)(this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
            _M_impl.super__Vector_impl_data._M_start != 0x8fffffff70) {
    AbstractTransaction::AddTxIn
              (&this->super_AbstractTransaction,txid,index,sequence,unlocking_script);
    AbstractTxIn::AbstractTxIn(&local_150,txid,index,sequence);
    local_150._vptr_AbstractTxIn = (_func_int **)&PTR__AbstractTxIn_007408e8;
    bVar3 = Script::IsEmpty(unlocking_script);
    if (!bVar3) {
      AbstractTxIn::AbstractTxIn(&local_c0,txid,index,sequence,unlocking_script);
      local_c0._vptr_AbstractTxIn = (_func_int **)&PTR__AbstractTxIn_007408e8;
      Txid::operator=(&local_150.txid_,&local_c0.txid_);
      local_150.vout_ = local_c0.vout_;
      Script::operator=(&local_150.unlocking_script_,&local_c0.unlocking_script_);
      local_150.sequence_ = local_c0.sequence_;
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&local_150.script_witness_.witness_stack_,&local_c0.script_witness_.witness_stack_)
      ;
      AbstractTxIn::~AbstractTxIn(&local_c0);
    }
    ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::push_back
              (&this->vin_,(value_type *)&local_150);
    (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[10])(this,1);
    pTVar1 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pTVar2 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
             _M_impl.super__Vector_impl_data._M_start;
    AbstractTxIn::~AbstractTxIn(&local_150);
    return (int)((ulong)((long)pTVar1 - (long)pTVar2) >> 4) * 0x38e38e39 - 1;
  }
  local_150._vptr_AbstractTxIn = (_func_int **)0x5e851e;
  local_150.txid_._vptr_Txid._0_4_ = 0x234;
  local_150.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "AddTxIn";
  logger::log<>((CfdSourceLocation *)&local_150,kCfdLogLevelWarning,"vin maximum.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_150._vptr_AbstractTxIn = (_func_int **)&local_150.txid_.data_;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"txin maximum.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&local_150);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t Transaction::AddTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script) {
  if (vin_.size() == std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "vin maximum.");
    throw CfdException(kCfdIllegalStateError, "txin maximum.");
  }

  AbstractTransaction::AddTxIn(txid, index, sequence, unlocking_script);
  TxIn txin(txid, index, sequence);
  if (!unlocking_script.IsEmpty()) {
    txin = TxIn(txid, index, sequence, unlocking_script);
  }

  vin_.push_back(txin);

  CallbackStateChange(kStateChangeAddTxIn);
  return static_cast<uint32_t>(vin_.size() - 1);
}